

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O3

void __thiscall Rnase::Rnase(Rnase *this,int footprint,double speed)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"__rnase","");
  MobileElement::MobileElement(&this->super_MobileElement,&local_40,footprint,speed);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_MobileElement)._vptr_MobileElement = (_func_int **)&PTR__MobileElement_001a56b0;
  return;
}

Assistant:

Rnase::Rnase(int footprint, double speed)
    : MobileElement("__rnase", footprint, speed) {}